

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  bool bVar1;
  MemoryLeakOutputStringBuffer *in_RCX;
  MemoryLeakDetectorNode *in_RDX;
  long *in_RSI;
  MemoryLeakDetector *in_RDI;
  long *in_R8;
  byte in_R9B;
  TestMemoryAllocator *in_stack_ffffffffffffff78;
  TestMemoryAllocator *in_stack_ffffffffffffff80;
  MemoryLeakDetector *in_stack_ffffffffffffff88;
  MemoryLeakFailure *in_stack_ffffffffffffff90;
  TestMemoryAllocator *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  MemoryLeakOutputStringBuffer *freeLineNumber;
  char *in_stack_ffffffffffffffa8;
  MemoryLeakDetectorNode *in_stack_ffffffffffffffb0;
  MemoryLeakOutputStringBuffer *in_stack_ffffffffffffffb8;
  
  (**(code **)(*(long *)in_RSI[5] + 0x50))();
  (**(code **)(*in_R8 + 0x50))();
  bVar1 = matchingAllocation(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78);
  if (bVar1) {
    bVar1 = validMemoryCorruptionInformation(in_RDI,(char *)(in_RSI[2] + *in_RSI));
    if (bVar1) {
      if ((in_R9B & 1) != 0) {
        (**(code **)(*in_R8 + 0x48))(in_R8,in_RSI);
      }
    }
    else {
      (**(code **)(*in_R8 + 0x50))();
      MemoryLeakOutputStringBuffer::reportMemoryCorruptionFailure
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,(TestMemoryAllocator *)in_RCX,(MemoryLeakFailure *)in_RDX
                );
    }
  }
  else {
    freeLineNumber = &in_RDI->outputBuffer_;
    (**(code **)(*in_R8 + 0x50))();
    MemoryLeakOutputStringBuffer::reportAllocationDeallocationMismatchFailure
              (in_RCX,in_RDX,(char *)in_RSI,(size_t)freeLineNumber,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}